

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d)

{
  reference pcVar1;
  char *pcVar2;
  long lVar3;
  LogMessage *other;
  LogFinisher local_9a;
  byte local_99;
  LogMessage local_98;
  char *local_60;
  char *out;
  reference local_50;
  char *begin;
  undefined1 local_31;
  AlphaNum *local_30;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result;
  
  local_31 = 0;
  local_30 = c;
  d_local = b;
  c_local = a;
  b_local = (AlphaNum *)this;
  a_local = (AlphaNum *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  strings::AlphaNum::size(b_local);
  strings::AlphaNum::size(c_local);
  strings::AlphaNum::size(d_local);
  strings::AlphaNum::size(local_30);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  out = (char *)std::__cxx11::string::begin();
  local_50 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&out);
  pcVar2 = Append4(local_50,b_local,c_local,d_local,local_30);
  pcVar1 = local_50;
  local_60 = pcVar2;
  lVar3 = std::__cxx11::string::size();
  local_99 = 0;
  if (pcVar2 != pcVar1 + lVar3) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x5dd);
    local_99 = 1;
    other = internal::LogMessage::operator<<
                      (&local_98,"CHECK failed: (out) == (begin + result.size()): ");
    internal::LogFinisher::operator=(&local_9a,other);
  }
  if ((local_99 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c,
              const AlphaNum &d) {
  string result;
  result.resize(a.size() + b.size() + c.size() + d.size());
  char *const begin = &*result.begin();
  char *out = Append4(begin, a, b, c, d);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}